

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O3

string_view gmlc::utilities::string_viewOps::trim(string_view input,string_view trimCharacters)

{
  void *pvVar1;
  size_type sVar2;
  ulong uVar3;
  char *__str;
  size_t __n;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  string_view sVar7;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  pcVar5 = input._M_str;
  uVar6 = input._M_len;
  __str = trimCharacters._M_str;
  __n = trimCharacters._M_len;
  if (uVar6 != 0) {
    local_40._M_len = uVar6;
    local_40._M_str = pcVar5;
    if (__n == 0) {
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                        (&local_40,__str,0xffffffffffffffff,0);
      uVar4 = 0;
LAB_003e8fb0:
      uVar3 = (sVar2 - uVar4) + 1;
      uVar6 = local_40._M_len - uVar4;
      if (uVar3 <= local_40._M_len - uVar4) {
        uVar6 = uVar3;
      }
      local_40._M_str = local_40._M_str + uVar4;
      goto LAB_003e8fcc;
    }
    uVar4 = 0;
    do {
      pvVar1 = memchr(__str,(int)pcVar5[uVar4],__n);
      if (pvVar1 == (void *)0x0) {
        if (uVar4 != 0xffffffffffffffff) {
          sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                            (&local_40,__str,0xffffffffffffffff,__n);
          if (local_40._M_len < uVar4) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",uVar4,local_40._M_len);
          }
          goto LAB_003e8fb0;
        }
        break;
      }
      uVar4 = uVar4 + 1;
    } while (uVar6 != uVar4);
  }
  uVar6 = 0;
  local_40._M_str = (char *)0x0;
LAB_003e8fcc:
  sVar7._M_str = local_40._M_str;
  sVar7._M_len = uVar6;
  return sVar7;
}

Assistant:

std::string_view trim(std::string_view input, std::string_view trimCharacters)
{
    const auto strStart = input.find_first_not_of(trimCharacters);
    if (strStart == std::string::npos) {
        return {};  // no content
    }

    const auto strEnd = input.find_last_not_of(trimCharacters);

    return input.substr(strStart, strEnd - strStart + 1);
}